

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_image.cc
# Opt level: O0

void __thiscall InputImage::InputImage(InputImage *this,char *filename)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ostream *poVar3;
  istream *this_00;
  ulong uVar4;
  ulong uVar5;
  Complex *pCVar6;
  Complex *local_288;
  Complex local_240;
  float local_238;
  int local_234;
  float real;
  int c;
  int r;
  long local_220;
  ifstream ifs;
  char *filename_local;
  InputImage *this_local;
  
  std::ifstream::ifstream(&local_220,filename,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar2 & 1) == 0) {
    this_00 = (istream *)std::istream::operator>>((istream *)&local_220,&this->w);
    std::istream::operator>>(this_00,&this->h);
    uVar4 = (ulong)(this->w * this->h);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pCVar6 = (Complex *)operator_new__(uVar5);
    if (uVar4 != 0) {
      local_288 = pCVar6;
      do {
        Complex::Complex(local_288);
        local_288 = local_288 + 1;
      } while (local_288 != pCVar6 + uVar4);
    }
    this->data = pCVar6;
    for (real = 0.0; (int)real < this->h; real = (float)((int)real + 1)) {
      for (local_234 = 0; local_234 < this->w; local_234 = local_234 + 1) {
        std::istream::operator>>((istream *)&local_220,&local_238);
        Complex::Complex(&local_240,local_238);
        this->data[(int)real * this->w + local_234] = local_240;
      }
    }
    std::ifstream::~ifstream(&local_220);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Can\'t open image file ");
  poVar3 = std::operator<<(poVar3,filename);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

InputImage::InputImage(const char* filename) {
    std::ifstream ifs(filename);
    if(!ifs) {
        std::cout << "Can't open image file " << filename << std::endl;
        exit(1);
    }

    ifs >> w >> h;
    data = new Complex[w * h];
    for(int r = 0; r < h; ++r) {
        for(int c = 0; c < w; ++c) {
            float real;
            ifs >> real;
            data[r * w + c] = Complex(real);
        }
    }
}